

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::Scrollbar(ImGuiAxis axis)

{
  bool bVar1;
  ImGuiWindow *this;
  ImDrawList *this_00;
  ulong uVar2;
  ImGuiContext *pIVar3;
  ImGuiID IVar4;
  ImU32 IVar5;
  int iVar6;
  ImVec2 *pIVar7;
  ImRect *pIVar8;
  char *str;
  ImGuiCol idx;
  float *pfVar9;
  long lVar10;
  undefined1 auVar11 [12];
  float fVar12;
  bool bVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  bool held;
  bool hovered;
  bool local_ee;
  bool local_ed;
  undefined1 local_ec [8];
  ImVec2 local_e4;
  ImGuiID local_dc;
  undefined1 local_d8 [16];
  float local_c8;
  float local_c4;
  ImGuiID local_c0;
  float local_bc;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  float local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  ImVec2 local_40;
  ImVec2 IStack_38;
  
  pIVar3 = GImGui;
  local_b8._8_8_ = local_b8._0_8_;
  this = GImGui->CurrentWindow;
  str = "#SCROLLY";
  if (axis == ImGuiAxis_X) {
    str = "#SCROLLX";
  }
  IVar4 = ImGuiWindow::GetIDNoKeepAlive(this,str,(char *)0x0);
  KeepAliveID(IVar4);
  bVar1 = (&this->ScrollbarX)[axis == ImGuiAxis_X];
  local_d8._0_4_ = 0.0;
  if (bVar1 == true) {
    local_d8._0_4_ = (pIVar3->Style).ScrollbarSize;
  }
  fVar12 = (this->Pos).x;
  fVar15 = (this->Pos).y;
  local_c4 = (this->Size).x + fVar12;
  local_bc = (this->Size).y + fVar15;
  fVar17 = this->WindowBorderSize;
  if (axis == ImGuiAxis_X) {
    fVar14 = local_bc - (pIVar3->Style).ScrollbarSize;
    fVar16 = fVar12 + fVar17;
    local_e4.x = local_c4 - (float)local_d8._0_4_;
    local_e4.y = local_bc;
  }
  else {
    fVar16 = local_c4 - (pIVar3->Style).ScrollbarSize;
    fVar14 = fVar15 + fVar17;
    local_e4.x = local_c4;
    local_e4.y = local_bc - (float)local_d8._0_4_;
  }
  local_e4.y = local_e4.y - fVar17;
  local_e4.x = local_e4.x - fVar17;
  local_ec._0_4_ =
       ~-(uint)(fVar16 <= fVar12) & (uint)fVar16 | (uint)fVar12 & -(uint)(fVar16 <= fVar12);
  local_ec._4_4_ =
       ~-(uint)(fVar14 <= fVar15) & (uint)fVar14 | (uint)fVar15 & -(uint)(fVar14 <= fVar15);
  if (axis != ImGuiAxis_X) {
    fVar15 = 0.0;
    fVar12 = 0.0;
    if ((this->Flags & 1U) == 0) {
      fVar12 = (GImGui->Style).FramePadding.y;
      fVar12 = fVar12 + fVar12 + GImGui->FontBaseSize * this->FontWindowScale;
    }
    if (((uint)this->Flags >> 10 & 1) != 0) {
      fVar15 = (GImGui->Style).FramePadding.y;
      fVar15 = fVar15 + fVar15 +
               GImGui->FontBaseSize * this->FontWindowScale + (this->DC).MenuBarOffset.y;
    }
    local_ec._4_4_ = (float)local_ec._4_4_ + fVar12 + fVar15;
  }
  if ((0.0 < local_e4.x - (float)local_ec._0_4_) &&
     (fVar12 = local_e4.y - (float)local_ec._4_4_, 0.0 < fVar12)) {
    local_68._0_12_ = ZEXT812(0x3f800000);
    local_68._12_4_ = 0;
    if (axis == ImGuiAxis_Y) {
      fVar15 = (pIVar3->Style).FramePadding.y;
      fVar15 = fVar15 + fVar15;
      if (fVar12 < fVar15 + pIVar3->FontSize) {
        fVar15 = (fVar12 - pIVar3->FontSize) / fVar15;
        auVar11 = ZEXT812(0x3f800000);
        if (fVar15 <= 1.0) {
          auVar11._4_8_ = 0;
          auVar11._0_4_ = fVar15;
        }
        local_68._0_4_ = ~-(uint)(fVar15 < 0.0) & auVar11._0_4_;
        local_68._4_4_ = 0;
        local_68._8_4_ = auVar11._8_4_;
        local_68._12_4_ = 0;
        if ((float)local_68._0_4_ <= 0.0) {
          return;
        }
      }
    }
    local_a8 = ZEXT416((uint)fVar12);
    local_88 = ZEXT416((uint)(local_e4.x - (float)local_ec._0_4_));
    if (axis == ImGuiAxis_X) {
      iVar6 = (uint)(bVar1 ^ 1) * 8 + 4;
      lVar10 = 0x20;
      local_b8._0_8_ = 0x30;
    }
    else {
      iVar6 = ((uint)~this->Flags >> 9 & -(this->Flags & 1U) & 2) + (uint)(bVar1 ^ 1) * 8;
      lVar10 = 0x24;
      local_b8._0_8_ = 0x34;
    }
    this_00 = this->DrawList;
    local_dc = IVar4;
    IVar5 = GetColorU32(0xe,1.0);
    ImDrawList::AddRectFilled(this_00,(ImVec2 *)local_ec,&local_e4,IVar5,this->WindowRounding,iVar6)
    ;
    fVar12 = ((float)local_88._0_4_ + -2.0) * 0.5;
    iVar6 = (int)fVar12;
    fVar15 = -3.0;
    fVar17 = -3.0;
    if (iVar6 < 4) {
      fVar17 = -(float)(int)fVar12;
    }
    fVar12 = -0.0;
    if (-1 < iVar6) {
      fVar12 = fVar17;
    }
    fVar17 = ((float)local_a8._0_4_ + -2.0) * 0.5;
    iVar6 = (int)fVar17;
    if (iVar6 < 4) {
      fVar15 = -(float)(int)fVar17;
    }
    fVar17 = -0.0;
    if (-1 < iVar6) {
      fVar17 = fVar15;
    }
    local_ec._0_4_ = (float)local_ec._0_4_ - fVar12;
    local_ec._4_4_ = (float)local_ec._4_4_ - fVar17;
    local_e4.x = fVar12 + local_e4.x;
    local_e4.y = fVar17 + local_e4.y;
    if (axis == ImGuiAxis_X) {
      fVar12 = local_e4.x - (float)local_ec._0_4_;
    }
    else {
      fVar12 = local_e4.y - (float)local_ec._4_4_;
    }
    local_88._0_4_ = fVar12;
    fVar15 = *(float *)((long)&this->Name + lVar10) - (float)local_d8._0_4_;
    fVar12 = *(float *)((long)&this->Name + local_b8._0_8_);
    local_b8 = ZEXT416((uint)fVar12);
    local_a8 = ZEXT416((uint)fVar15);
    local_98 = (float)(~-(uint)(fVar15 <= fVar12) & (uint)fVar15 |
                      -(uint)(fVar15 <= fVar12) & (uint)fVar12);
    uStack_94 = 0;
    uStack_90 = 0;
    uStack_8c = 0;
    if (local_98 <= 0.0) {
      __assert_fail("ImMax(win_size_contents_v, win_size_avail_v) > 0.0f",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/imgui-1.70/imgui_widgets.cpp"
                    ,0x342,"void ImGui::Scrollbar(ImGuiAxis)");
    }
    pfVar9 = &(this->Scroll).y;
    pIVar7 = (ImVec2 *)pfVar9;
    if (axis == ImGuiAxis_X) {
      pIVar7 = &this->Scroll;
    }
    local_d8 = ZEXT416((uint)pIVar7->x);
    local_78 = ZEXT416((uint)(pIVar3->Style).GrabMinSize);
    local_ee = false;
    local_ed = false;
    local_c0 = pIVar3->ActiveId;
    ButtonBehavior((ImRect *)local_ec,local_dc,&local_ed,&local_ee,0x2000);
    IVar4 = local_dc;
    fVar12 = 1.0;
    fVar15 = local_98;
    if (local_98 <= 1.0) {
      fVar15 = fVar12;
    }
    fVar17 = ((float)local_a8._0_4_ / fVar15) * (float)local_88._0_4_;
    fVar15 = (float)local_88._0_4_;
    if (fVar17 <= (float)local_88._0_4_) {
      fVar15 = fVar17;
    }
    local_a8._4_4_ = local_a8._4_4_ & local_78._4_4_;
    local_a8._8_4_ = local_a8._8_4_ & local_78._8_4_;
    local_a8._12_4_ = local_a8._12_4_ & local_78._12_4_;
    fVar17 = (float)(-(uint)(fVar17 < (float)local_78._0_4_) & local_78._0_4_ |
                    ~-(uint)(fVar17 < (float)local_78._0_4_) & (uint)fVar15);
    fVar15 = fVar12;
    if (1.0 <= (float)local_b8._0_4_ - (float)local_a8._0_4_) {
      fVar15 = (float)local_b8._0_4_ - (float)local_a8._0_4_;
    }
    local_d8._0_4_ = (float)local_d8._0_4_ / fVar15;
    if ((float)local_d8._0_4_ <= 1.0) {
      fVar12 = (float)local_d8._0_4_;
    }
    local_d8 = ZEXT416((uint)(((float)(~-(uint)((float)local_d8._0_4_ < 0.0) & (uint)fVar12) *
                              ((float)local_88._0_4_ - fVar17)) / (float)local_88._0_4_));
    local_a8._0_4_ = fVar17;
    if (((1.0 <= (float)local_68._0_4_) && (fVar17 / (float)local_88._0_4_ < 1.0)) &&
       (local_ee != false)) {
      local_78._0_4_ = fVar15;
      local_b8._0_8_ = &this->Scroll;
      pIVar8 = (ImRect *)(local_ec + 4);
      if (axis == ImGuiAxis_X) {
        pIVar8 = (ImRect *)local_ec;
      }
      uVar2 = (ulong)(axis != ImGuiAxis_X);
      local_58 = ZEXT416((uint)(*(float *)((pIVar3->IO).MouseDown + uVar2 * 4 + -8) -
                               (pIVar8->Min).x));
      local_c8 = (float)local_88._0_4_ - fVar17;
      local_98 = fVar17 / (float)local_88._0_4_;
      uStack_94 = local_a8._4_4_;
      uStack_90 = local_a8._8_4_;
      uStack_8c = local_a8._12_4_;
      SetHoveredID(local_dc);
      fVar15 = (float)local_58._0_4_ / (float)local_88._0_4_;
      fVar12 = 1.0;
      if (fVar15 <= 1.0) {
        fVar12 = fVar15;
      }
      fVar17 = 0.0;
      fVar12 = (float)(~-(uint)(fVar15 < 0.0) & (uint)fVar12);
      if (local_c0 == IVar4) {
        bVar13 = false;
      }
      else {
        bVar1 = local_98 + (float)local_d8._0_4_ < fVar12;
        bVar13 = bVar1 || fVar12 < (float)local_d8._0_4_;
        if (!bVar1 && fVar12 >= (float)local_d8._0_4_) {
          fVar17 = local_98 * -0.5 + (fVar12 - (float)local_d8._0_4_);
        }
        (&(pIVar3->ScrollbarClickDeltaToGrabCenter).x)[uVar2] = fVar17;
      }
      fVar17 = ((fVar12 - (&(pIVar3->ScrollbarClickDeltaToGrabCenter).x)[uVar2]) - local_98 * 0.5) /
               (1.0 - local_98);
      fVar15 = 1.0;
      if (fVar17 <= 1.0) {
        fVar15 = fVar17;
      }
      fVar15 = (float)(int)((float)(~-(uint)(fVar17 < 0.0) & (uint)fVar15) * (float)local_78._0_4_ +
                           0.5);
      if (axis == ImGuiAxis_X) {
        pfVar9 = (float *)local_b8._0_8_;
      }
      *pfVar9 = fVar15;
      fVar15 = fVar15 / (float)local_78._0_4_;
      fVar17 = 1.0;
      if (fVar15 <= 1.0) {
        fVar17 = fVar15;
      }
      fVar15 = (local_c8 * (float)(~-(uint)(fVar15 < 0.0) & (uint)fVar17)) / (float)local_88._0_4_;
      local_d8 = ZEXT416((uint)fVar15);
      if (bVar13) {
        (&(pIVar3->ScrollbarClickDeltaToGrabCenter).x)[uVar2] = -local_98 * 0.5 + (fVar12 - fVar15);
      }
    }
    idx = 0x11;
    if (local_ee == false) {
      idx = (local_ed & 1) + 0xf;
    }
    IVar5 = GetColorU32(idx,(float)local_68._0_4_);
    if (axis == ImGuiAxis_X) {
      local_40.x = (float)local_ec._0_4_ +
                   (local_e4.x - (float)local_ec._0_4_) * (float)local_d8._0_4_;
      local_40.y = (float)local_ec._4_4_;
      IStack_38.x = (float)local_a8._0_4_ + local_40.x;
      IStack_38.y = local_e4.y;
      if (local_c4 <= (float)local_a8._0_4_ + local_40.x) {
        IStack_38.x = local_c4;
      }
    }
    else {
      local_40.y = (local_e4.y - (float)local_ec._4_4_) * (float)local_d8._0_4_ +
                   (float)local_ec._4_4_;
      IStack_38.y = (float)local_a8._0_4_ + local_40.y;
      IStack_38.x = local_e4.x;
      local_40.x = (float)local_ec._0_4_;
      if (local_bc <= IStack_38.y) {
        IStack_38.y = local_bc;
      }
    }
    ImDrawList::AddRectFilled
              (this->DrawList,&local_40,&IStack_38,IVar5,(pIVar3->Style).ScrollbarRounding,0xf);
  }
  return;
}

Assistant:

void ImGui::Scrollbar(ImGuiAxis axis)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    const bool horizontal = (axis == ImGuiAxis_X);
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = GetScrollbarID(window, axis);
    KeepAliveID(id);

    // Render background
    bool other_scrollbar = (horizontal ? window->ScrollbarY : window->ScrollbarX);
    float other_scrollbar_size_w = other_scrollbar ? style.ScrollbarSize : 0.0f;
    const ImRect host_rect = window->Rect();
    const float border_size = window->WindowBorderSize;
    ImRect bb = horizontal
        ? ImRect(host_rect.Min.x + border_size, host_rect.Max.y - style.ScrollbarSize, host_rect.Max.x - other_scrollbar_size_w - border_size, host_rect.Max.y - border_size)
        : ImRect(host_rect.Max.x - style.ScrollbarSize, host_rect.Min.y + border_size, host_rect.Max.x - border_size, host_rect.Max.y - other_scrollbar_size_w - border_size);
    bb.Min.x = ImMax(host_rect.Min.x, bb.Min.x); // Handle case where the host rectangle is smaller than the scrollbar
    bb.Min.y = ImMax(host_rect.Min.y, bb.Min.y);
    if (!horizontal)
        bb.Min.y += window->TitleBarHeight() + ((window->Flags & ImGuiWindowFlags_MenuBar) ? window->MenuBarHeight() : 0.0f); // FIXME: InnerRect?

    const float bb_width = bb.GetWidth();
    const float bb_height = bb.GetHeight();
    if (bb_width <= 0.0f || bb_height <= 0.0f)
        return;

    // When we are too small, start hiding and disabling the grab (this reduce visual noise on very small window and facilitate using the resize grab)
    float alpha = 1.0f;
    if ((axis == ImGuiAxis_Y) && bb_height < g.FontSize + g.Style.FramePadding.y * 2.0f)
    {
        alpha = ImSaturate((bb_height - g.FontSize) / (g.Style.FramePadding.y * 2.0f));
        if (alpha <= 0.0f)
            return;
    }
    const bool allow_interaction = (alpha >= 1.0f);

    int window_rounding_corners;
    if (horizontal)
        window_rounding_corners = ImDrawCornerFlags_BotLeft | (other_scrollbar ? 0 : ImDrawCornerFlags_BotRight);
    else
        window_rounding_corners = (((window->Flags & ImGuiWindowFlags_NoTitleBar) && !(window->Flags & ImGuiWindowFlags_MenuBar)) ? ImDrawCornerFlags_TopRight : 0) | (other_scrollbar ? 0 : ImDrawCornerFlags_BotRight);
    window->DrawList->AddRectFilled(bb.Min, bb.Max, GetColorU32(ImGuiCol_ScrollbarBg), window->WindowRounding, window_rounding_corners);
    bb.Expand(ImVec2(-ImClamp((float)(int)((bb_width - 2.0f) * 0.5f), 0.0f, 3.0f), -ImClamp((float)(int)((bb_height - 2.0f) * 0.5f), 0.0f, 3.0f)));

    // V denote the main, longer axis of the scrollbar (= height for a vertical scrollbar)
    float scrollbar_size_v = horizontal ? bb.GetWidth() : bb.GetHeight();
    float scroll_v = horizontal ? window->Scroll.x : window->Scroll.y;
    float win_size_avail_v = (horizontal ? window->SizeFull.x : window->SizeFull.y) - other_scrollbar_size_w;
    float win_size_contents_v = horizontal ? window->SizeContents.x : window->SizeContents.y;

    // Calculate the height of our grabbable box. It generally represent the amount visible (vs the total scrollable amount)
    // But we maintain a minimum size in pixel to allow for the user to still aim inside.
    IM_ASSERT(ImMax(win_size_contents_v, win_size_avail_v) > 0.0f); // Adding this assert to check if the ImMax(XXX,1.0f) is still needed. PLEASE CONTACT ME if this triggers.
    const float win_size_v = ImMax(ImMax(win_size_contents_v, win_size_avail_v), 1.0f);
    const float grab_h_pixels = ImClamp(scrollbar_size_v * (win_size_avail_v / win_size_v), style.GrabMinSize, scrollbar_size_v);
    const float grab_h_norm = grab_h_pixels / scrollbar_size_v;

    // Handle input right away. None of the code of Begin() is relying on scrolling position before calling Scrollbar().
    bool held = false;
    bool hovered = false;
    const bool previously_held = (g.ActiveId == id);
    ButtonBehavior(bb, id, &hovered, &held, ImGuiButtonFlags_NoNavFocus);

    float scroll_max = ImMax(1.0f, win_size_contents_v - win_size_avail_v);
    float scroll_ratio = ImSaturate(scroll_v / scroll_max);
    float grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v;
    if (held && allow_interaction && grab_h_norm < 1.0f)
    {
        float scrollbar_pos_v = horizontal ? bb.Min.x : bb.Min.y;
        float mouse_pos_v = horizontal ? g.IO.MousePos.x : g.IO.MousePos.y;
        float* click_delta_to_grab_center_v = horizontal ? &g.ScrollbarClickDeltaToGrabCenter.x : &g.ScrollbarClickDeltaToGrabCenter.y;

        // Click position in scrollbar normalized space (0.0f->1.0f)
        const float clicked_v_norm = ImSaturate((mouse_pos_v - scrollbar_pos_v) / scrollbar_size_v);
        SetHoveredID(id);

        bool seek_absolute = false;
        if (!previously_held)
        {
            // On initial click calculate the distance between mouse and the center of the grab
            if (clicked_v_norm >= grab_v_norm && clicked_v_norm <= grab_v_norm + grab_h_norm)
            {
                *click_delta_to_grab_center_v = clicked_v_norm - grab_v_norm - grab_h_norm*0.5f;
            }
            else
            {
                seek_absolute = true;
                *click_delta_to_grab_center_v = 0.0f;
            }
        }

        // Apply scroll
        // It is ok to modify Scroll here because we are being called in Begin() after the calculation of SizeContents and before setting up our starting position
        const float scroll_v_norm = ImSaturate((clicked_v_norm - *click_delta_to_grab_center_v - grab_h_norm*0.5f) / (1.0f - grab_h_norm));
        scroll_v = (float)(int)(0.5f + scroll_v_norm * scroll_max);//(win_size_contents_v - win_size_v));
        if (horizontal)
            window->Scroll.x = scroll_v;
        else
            window->Scroll.y = scroll_v;

        // Update values for rendering
        scroll_ratio = ImSaturate(scroll_v / scroll_max);
        grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v;

        // Update distance to grab now that we have seeked and saturated
        if (seek_absolute)
            *click_delta_to_grab_center_v = clicked_v_norm - grab_v_norm - grab_h_norm*0.5f;
    }

    // Render grab
    const ImU32 grab_col = GetColorU32(held ? ImGuiCol_ScrollbarGrabActive : hovered ? ImGuiCol_ScrollbarGrabHovered : ImGuiCol_ScrollbarGrab, alpha);
    ImRect grab_rect;
    if (horizontal)
        grab_rect = ImRect(ImLerp(bb.Min.x, bb.Max.x, grab_v_norm), bb.Min.y, ImMin(ImLerp(bb.Min.x, bb.Max.x, grab_v_norm) + grab_h_pixels, host_rect.Max.x), bb.Max.y);
    else
        grab_rect = ImRect(bb.Min.x, ImLerp(bb.Min.y, bb.Max.y, grab_v_norm), bb.Max.x, ImMin(ImLerp(bb.Min.y, bb.Max.y, grab_v_norm) + grab_h_pixels, host_rect.Max.y));
    window->DrawList->AddRectFilled(grab_rect.Min, grab_rect.Max, grab_col, style.ScrollbarRounding);
}